

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3BtreeBeginStmt(Btree *p,int iStatement)

{
  int *piVar1;
  BtShared *pBVar2;
  Pager *pPager;
  int iVar3;
  
  pBVar2 = p->pBt;
  if ((p->sharable != '\0') && (p->wantToLock = p->wantToLock + 1, p->locked == '\0')) {
    btreeLockCarefully(p);
  }
  pPager = pBVar2->pPager;
  iVar3 = 0;
  if ((pPager->nSavepoint < iStatement) && (iVar3 = 0, pPager->useJournal != '\0')) {
    iVar3 = pagerOpenSavepoint(pPager,iStatement);
  }
  if (p->sharable != '\0') {
    piVar1 = &p->wantToLock;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      unlockBtreeMutex(p);
    }
  }
  return iVar3;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeBeginStmt(Btree *p, int iStatement){
  int rc;
  BtShared *pBt = p->pBt;
  sqlite3BtreeEnter(p);
  assert( p->inTrans==TRANS_WRITE );
  assert( (pBt->btsFlags & BTS_READ_ONLY)==0 );
  assert( iStatement>0 );
  assert( iStatement>p->db->nSavepoint );
  assert( pBt->inTransaction==TRANS_WRITE );
  /* At the pager level, a statement transaction is a savepoint with
  ** an index greater than all savepoints created explicitly using
  ** SQL statements. It is illegal to open, release or rollback any
  ** such savepoints while the statement transaction savepoint is active.
  */
  rc = sqlite3PagerOpenSavepoint(pBt->pPager, iStatement);
  sqlite3BtreeLeave(p);
  return rc;
}